

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::FinalizeFuncInfos(ByteCodeGenerator *this)

{
  ParseableFunctionInfo *this_00;
  code *pcVar1;
  FuncInfo **this_01;
  bool bVar2;
  Attributes AVar3;
  undefined4 *puVar4;
  Type_conflict node;
  Type *ppFVar5;
  FuncInfo **funcInfo;
  Iterator __iter;
  ByteCodeGenerator *this_local;
  
  if (this->funcInfosToFinalize != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    __iter.current = (NodeBase *)this;
    _funcInfo = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                          (&this->funcInfosToFinalize->
                            super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    while( true ) {
      if (__iter.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this_01 = funcInfo;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)this_01,node);
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&funcInfo);
      if ((*(uint *)&(*ppFVar5)->field_0xb4 & 1) != 0) {
        this_00 = (*ppFVar5)->byteCodeFunction;
        AVar3 = Js::FunctionProxy::GetAttributes(&(*ppFVar5)->byteCodeFunction->super_FunctionProxy)
        ;
        Js::FunctionProxy::SetAttributes(&this_00->super_FunctionProxy,AVar3 | CanDefer);
      }
    }
    this->funcInfosToFinalize = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeFuncInfos()
{
    if (this->funcInfosToFinalize == nullptr)
    {
        return;
    }

    FOREACH_SLIST_ENTRY(FuncInfo*, funcInfo, this->funcInfosToFinalize)
    {
        if (funcInfo->canDefer)
        {
            funcInfo->byteCodeFunction->SetAttributes((Js::FunctionInfo::Attributes)(funcInfo->byteCodeFunction->GetAttributes() | Js::FunctionInfo::Attributes::CanDefer));
        }
    }
    NEXT_SLIST_ENTRY;

    this->funcInfosToFinalize = nullptr;
}